

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjLookupTable::add_entry(CVmObjLookupTable *this,vm_val_t *key,vm_val_t *val)

{
  undefined4 uVar1;
  uint uVar2;
  vm_lookup_val *pvVar3;
  vm_lookup_ext *pvVar4;
  vm_val_t *in_RDX;
  vm_val_t *in_RSI;
  CVmObjLookupTable *in_RDI;
  vm_lookup_val *entry;
  uint hashval;
  CVmObjLookupTable *in_stack_ffffffffffffffd0;
  vm_val_t *in_stack_ffffffffffffffd8;
  vm_lookup_val *pvVar5;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  CVmStack::push(in_RSI);
  CVmStack::push(in_RDX);
  uVar2 = calc_key_hash((CVmObjLookupTable *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffd8);
  pvVar3 = alloc_new_entry(in_stack_ffffffffffffffd0);
  pvVar4 = get_ext(in_RDI);
  pvVar3->nxt = pvVar4->buckets[uVar2];
  pvVar5 = pvVar3;
  pvVar4 = get_ext(in_RDI);
  pvVar4->buckets[uVar2] = pvVar3;
  uVar1 = *(undefined4 *)&in_RSI->field_0x4;
  (pvVar5->key).typ = in_RSI->typ;
  *(undefined4 *)&(pvVar5->key).field_0x4 = uVar1;
  (pvVar5->key).val = in_RSI->val;
  uVar1 = *(undefined4 *)&in_RDX->field_0x4;
  (pvVar5->val).typ = in_RDX->typ;
  *(undefined4 *)&(pvVar5->val).field_0x4 = uVar1;
  (pvVar5->val).val = in_RDX->val;
  CVmStack::discard(2);
  return;
}

Assistant:

void CVmObjLookupTable::add_entry(VMG_ 
                                  const vm_val_t *key, const vm_val_t *val)
{
    uint hashval;
    vm_lookup_val *entry;

    /* push the key and value as gc protection for a moment */
    G_stk->push(key);
    G_stk->push(val);
    
    /* calculate the hash value for the key */
    hashval = calc_key_hash(vmg_ key);

    /* allocate an entry */
    entry = alloc_new_entry(vmg0_);

    /* link this entry into the chain at this hash value */
    entry->nxt = get_ext()->buckets[hashval];
    get_ext()->buckets[hashval] = entry;

    /* set the key and value for this entry */
    entry->key = *key;
    entry->val = *val;

    /* discard the gc protection */
    G_stk->discard(2);
}